

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int ON_2dSize::ComparePointer(ON_2dSize *lhs,ON_2dSize *rhs)

{
  uint uVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_2dSize *)0x0) {
    return -1;
  }
  uVar1 = 1;
  if (rhs != (ON_2dSize *)0x0) {
    if (lhs->cx < rhs->cx) {
      return -1;
    }
    if (lhs->cx <= rhs->cx) {
      uVar1 = 0xffffffff;
      if (rhs->cy <= lhs->cy) {
        uVar1 = (uint)(rhs->cy < lhs->cy);
      }
    }
  }
  return uVar1;
}

Assistant:

int ON_2dSize::ComparePointer(
  const ON_2dSize* lhs,
  const ON_2dSize* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return -1;
  if (nullptr == rhs)
    return 1;
  if (lhs->cx < rhs->cx)
    return -1;
  if (lhs->cx > rhs->cx)
    return 1;
  if (lhs->cy < rhs->cy)
    return -1;
  if (lhs->cy > rhs->cy)
    return 1;
  return 0;
}